

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<long_long> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<long_long>::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *this_local;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,this);
  return &this_00->super_ParamIteratorInterface<long_long>;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }